

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O0

Statistics * embree::SceneGraph::calculateStatistics(Ref<embree::SceneGraph::Node> *node)

{
  undefined8 *in_RSI;
  Statistics *in_RDI;
  Statistics *stat;
  
  Statistics::Statistics(in_RDI);
  (**(code **)(*(long *)*in_RSI + 0x48))((long *)*in_RSI,in_RDI);
  (**(code **)(*(long *)*in_RSI + 0x40))();
  return in_RDI;
}

Assistant:

SceneGraph::Statistics SceneGraph::calculateStatistics(Ref<Node> node)
  {
    SceneGraph::Statistics stat;
    node->calculateStatistics(stat);
    node->resetInDegree();
    return stat;
  }